

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLString.cpp
# Opt level: O3

int xercesc_4_0::XMLString::lastIndexOf(char *toSearch,char ch)

{
  ulong uVar1;
  long lVar2;
  int iVar3;
  size_t sVar4;
  ulong uVar5;
  
  sVar4 = strlen(toSearch);
  iVar3 = -1;
  if (-1 < (int)(uint)sVar4) {
    uVar5 = (ulong)((uint)sVar4 & 0x7fffffff);
    do {
      if ((long)uVar5 < 1) {
        return -1;
      }
      uVar1 = uVar5 - 1;
      lVar2 = uVar5 - 1;
      uVar5 = uVar1;
    } while (toSearch[lVar2] != ch);
    iVar3 = (int)uVar1;
  }
  return iVar3;
}

Assistant:

int XMLString::lastIndexOf(const char* const toSearch, const char ch)
{
    const int len = (int)strlen(toSearch);
    if (len < 0) {
        return -1;
    }

    for (int i = len-1; i >= 0; i--)
    {
        if (toSearch[i] == ch)
            return i;
    }
    return -1;
}